

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.cpp
# Opt level: O1

void __thiscall luna::ModuleManager::LoadString(ModuleManager *this,string *str,string *name)

{
  State *this_00;
  String *module;
  InStringStream is;
  Lexer lexer;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  InStringStream local_a8;
  Lexer local_80;
  
  io::text::InStringStream::InStringStream(&local_a8,str);
  this_00 = this->state_;
  module = State::GetString(this_00,name);
  local_c8._8_8_ = 0;
  pcStack_b0 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:51:21)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:51:21)>
             ::_M_manager;
  local_c8._M_unused._M_object = &local_a8;
  Lexer::Lexer(&local_80,this_00,module,(CharInStream *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  Load(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.token_buffer_._M_dataplus._M_p != &local_80.token_buffer_.field_2) {
    operator_delete(local_80.token_buffer_._M_dataplus._M_p);
  }
  if (local_80.in_stream_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.in_stream_.super__Function_base._M_manager)
              ((_Any_data *)&local_80.in_stream_,(_Any_data *)&local_80.in_stream_,__destroy_functor
              );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.str_._M_dataplus._M_p != &local_a8.str_.field_2) {
    operator_delete(local_a8.str_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ModuleManager::LoadString(const std::string &str, const std::string &name)
    {
        io::text::InStringStream is(str);
        Lexer lexer(state_, state_->GetString(name),
                    [&is] () { return is.GetChar(); });
        Load(lexer);
    }